

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O2

void __thiscall CodeGenGenericContext::InvalidateState(CodeGenGenericContext *this)

{
  long lVar1;
  
  for (lVar1 = 0x18; lVar1 != 0x238; lVar1 = lVar1 + 0x20) {
    *(undefined4 *)((long)this->genReg + lVar1 + -0x18) = 0;
  }
  for (lVar1 = 0; lVar1 != 0x200; lVar1 = lVar1 + 0x20) {
    *(undefined4 *)((long)&this->xmmReg[0].type + lVar1) = 0;
  }
  for (lVar1 = 0; lVar1 != 0x480; lVar1 = lVar1 + 0x48) {
    *(undefined4 *)((long)&this->memCache[0].address.type + lVar1) = 0;
    *(undefined4 *)((long)&this->memCache[0].value.type + lVar1) = 0;
  }
  this->memCacheNextSlot = 0;
  this->memCacheFreeSlotCount = 0;
  this->currFreeXmmReg = rXMM0;
  this->currFreeReg = 0;
  return;
}

Assistant:

void CodeGenGenericContext::InvalidateState()
{
#if defined(NULLC_OPTIMIZE_X86)
	for(unsigned i = 0; i < rRegCount; i++)
		genReg[i].type = x86Argument::argNone;

	for(unsigned i = 0; i < rXmmRegCount; i++)
		xmmReg[i].type = x86Argument::argNone;

	for(unsigned i = 0; i < memoryStateSize; i++)
	{
		memCache[i].address.type = x86Argument::argNone;
		memCache[i].value.type = x86Argument::argNone;
	}

	memCacheFreeSlotCount = 0;
	memCacheNextSlot = 0;
#endif

	currFreeXmmReg = rXMM0;
	currFreeReg = 0;
}